

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpAgent.cpp
# Opt level: O0

int __thiscall
HttpAgent::sendAndGet
          (HttpAgent *this,HttpRequest *req,HttpResponse *res,string *toSend,BodyHandler *handler)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  URI *other;
  char *name;
  ssize_t sVar4;
  ulong uVar5;
  socklen_t __len;
  Socket *pSVar6;
  void *__buf;
  int __flags;
  BodyHandler *pBVar7;
  IReaderWriter *local_2e8;
  IReaderWriter *local_2b8;
  IReaderWriter *local_278;
  IReaderWriter *local_210;
  int local_1e0;
  uint local_1ac;
  uint8_t *puStack_1a8;
  int buffer_len_1;
  char *buffer_1;
  char *encoding;
  uint8_t *puStack_190;
  int buffer_len;
  char *buffer;
  int length;
  int read_len;
  int local_178;
  ErrCode err;
  int ret;
  int len;
  bool first_line;
  string local_160;
  undefined1 local_13c [8];
  Address addr;
  URI uri;
  BodyHandler *handler_local;
  string *toSend_local;
  HttpResponse *res_local;
  HttpRequest *req_local;
  HttpAgent *this_local;
  
  __len = (socklen_t)toSend;
  pBVar7 = handler;
  other = HttpRequest::getURI(req);
  __flags = (int)pBVar7;
  URI::URI((URI *)(addr.mName + 8),other);
  URI::getHost_abi_cxx11_(&local_160,(URI *)(addr.mName + 8));
  name = (char *)std::__cxx11::string::c_str();
  iVar2 = URI::getPort((URI *)(addr.mName + 8));
  JetHead::Socket::Address::Address((Address *)local_13c,name,iVar2);
  std::__cxx11::string::~string((string *)&local_160);
  ret._3_1_ = 1;
  read_len = 0;
  JetHead::Socket::setReadTimeout(&this->mSock,5);
  local_178 = JetHead::Socket::connect(&this->mSock,(int)local_13c,(sockaddr *)0xa,__len);
  if (local_178 == 0) {
    pSVar6 = &this->mSock;
    local_1e0 = 0;
    if (pSVar6 != (Socket *)0x0) {
      local_1e0 = (int)this + 0xe8;
    }
    sVar4 = HttpHeaderBase::send((HttpHeaderBase *)req,local_1e0,__buf,(size_t)pSVar6,__flags);
    local_178 = (int)sVar4;
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      iVar2 = std::__cxx11::string::c_str();
      uVar3 = std::__cxx11::string::size();
      sVar4 = JetHead::Socket::write(&this->mSock,iVar2,(void *)(ulong)uVar3,(size_t)pSVar6);
      iVar2 = std::__cxx11::string::size();
      if ((int)sVar4 != iVar2) {
        this_local._4_4_ = 0xe;
        goto LAB_00124b9e;
      }
    }
    JetHead::CircularBuffer::clear(&this->mBuffer);
    do {
      pSVar6 = &this->mSock;
      local_210 = (IReaderWriter *)0x0;
      if (pSVar6 != (Socket *)0x0) {
        local_210 = &(this->mSock).super_IReaderWriter;
      }
      iVar2 = JetHead::CircularBuffer::getFreeSpace(&this->mBuffer);
      local_178 = JetHead::CircularBuffer::fillFromFile(&this->mBuffer,local_210,iVar2);
      if (local_178 < 1) {
        this_local._4_4_ = 0xd;
        goto LAB_00124b9e;
      }
      while (iVar2 = HttpHeaderBase::searchForLine(&this->mBuffer), 0 < iVar2) {
        if ((ret._3_1_ & 1) == 0) {
          err = (*(res->super_HttpHeader).super_HttpHeaderBase._vptr_HttpHeaderBase[3])(res,this);
        }
        else {
          err = (*(res->super_HttpHeader).super_HttpHeaderBase._vptr_HttpHeaderBase[2])(res,this);
          ret._3_1_ = 0;
        }
        if (-1 < (int)err) {
          JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)(ulong)err,(size_t)pSVar6);
        }
      }
      uVar3 = HttpHeaderBase::searchForLine(&this->mBuffer);
      pSVar6 = (Socket *)(ulong)uVar3;
      bVar1 = true;
      if (uVar3 == 0) {
        iVar2 = JetHead::CircularBuffer::getLength(&this->mBuffer);
        bVar1 = iVar2 < 2;
      }
    } while (bVar1);
    local_178 = HttpResponse::getResponseCode(res);
    JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x2,(size_t)pSVar6);
    buffer._0_4_ = 0;
    read_len = HttpHeaderBase::getFieldInt((HttpHeaderBase *)res,0x3f4,(int32_t *)&buffer);
    if (read_len == kNoError) {
      while (0 < (int)(uint)buffer) {
        puStack_190 = JetHead::CircularBuffer::getBytes
                                (&this->mBuffer,0,(int *)((long)&encoding + 4));
        if ((int)(uint)buffer < (int)encoding._4_4_) {
          encoding._4_4_ = (uint)buffer;
        }
        if (handler != (BodyHandler *)0x0) {
          (**(code **)(*(long *)handler + 0x10))(handler,puStack_190,encoding._4_4_);
        }
        JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)(ulong)encoding._4_4_,(size_t)pSVar6)
        ;
        pSVar6 = (Socket *)(ulong)encoding._4_4_;
        buffer._0_4_ = (uint)buffer - encoding._4_4_;
        if ((uint)buffer != 0) {
          local_178 = (**(code **)(*(long *)handler + 0x18))(handler,&this->mSock,(uint)buffer);
          if (local_178 < 0) {
            this_local._4_4_ = 0xd;
            goto LAB_00124b9e;
          }
          buffer._0_4_ = 0;
        }
      }
    }
    else {
      buffer_1 = HttpHeaderBase::getField((HttpHeaderBase *)res,0x410);
      if ((buffer_1 != (char *)0x0) && (iVar2 = strcmp(buffer_1,"chunked"), iVar2 == 0)) {
        while (buffer._4_4_ = parseChunkLine(&this->mBuffer,(int *)&buffer), (int)buffer._4_4_ < 1)
        {
          pSVar6 = &this->mSock;
          local_278 = (IReaderWriter *)0x0;
          if (pSVar6 != (Socket *)0x0) {
            local_278 = &(this->mSock).super_IReaderWriter;
          }
          iVar2 = JetHead::CircularBuffer::getFreeSpace(&this->mBuffer);
          local_178 = JetHead::CircularBuffer::fillFromFile(&this->mBuffer,local_278,iVar2);
          if (local_178 < 0) {
            jh_log_print(0,
                         "int HttpAgent::sendAndGet(HttpRequest &, HttpResponse &, const std::string &, BodyHandler *)"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/HttpAgent.cpp"
                         ,0xd7,"Socket read failed...");
            this_local._4_4_ = 0xd;
            goto LAB_00124b9e;
          }
          iVar2 = JetHead::CircularBuffer::byteAt(&this->mBuffer,0);
          if (iVar2 == 0xd) {
            JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x1,(size_t)pSVar6);
          }
          iVar2 = JetHead::CircularBuffer::byteAt(&this->mBuffer,0);
          if (iVar2 == 10) {
            JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x1,(size_t)pSVar6);
          }
        }
        JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)(ulong)buffer._4_4_,(size_t)pSVar6);
        while (0 < (int)(uint)buffer) {
          while (0 < (int)(uint)buffer) {
            puStack_1a8 = JetHead::CircularBuffer::getBytes(&this->mBuffer,0,(int *)&local_1ac);
            if ((int)(uint)buffer < (int)local_1ac) {
              local_1ac = (uint)buffer;
            }
            if ((handler != (BodyHandler *)0x0) && (local_1ac != 0)) {
              (**(code **)(*(long *)handler + 0x10))(handler,puStack_1a8,local_1ac);
              JetHead::CircularBuffer::read
                        (&this->mBuffer,0,(void *)(ulong)local_1ac,(size_t)pSVar6);
              pSVar6 = (Socket *)(ulong)local_1ac;
              buffer._0_4_ = (uint)buffer - local_1ac;
            }
            if ((uint)buffer != 0) {
              local_178 = (**(code **)(*(long *)handler + 0x18))(handler,&this->mSock,(uint)buffer);
              if (local_178 < 1) {
                if (local_178 == 0) {
                  this_local._4_4_ = 0;
                }
                else {
                  this_local._4_4_ = 0xd;
                }
                goto LAB_00124b9e;
              }
              buffer._0_4_ = 0;
            }
          }
          pSVar6 = &this->mSock;
          local_2b8 = (IReaderWriter *)0x0;
          if (pSVar6 != (Socket *)0x0) {
            local_2b8 = &(this->mSock).super_IReaderWriter;
          }
          iVar2 = JetHead::CircularBuffer::getFreeSpace(&this->mBuffer);
          local_178 = JetHead::CircularBuffer::fillFromFile(&this->mBuffer,local_2b8,iVar2);
          if (local_178 < 0) {
            jh_log_print(0,
                         "int HttpAgent::sendAndGet(HttpRequest &, HttpResponse &, const std::string &, BodyHandler *)"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/HttpAgent.cpp"
                         ,0x10c,"Socket read failed...");
            this_local._4_4_ = 0xd;
            goto LAB_00124b9e;
          }
          iVar2 = JetHead::CircularBuffer::byteAt(&this->mBuffer,0);
          if (iVar2 == 0xd) {
            JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x1,(size_t)pSVar6);
          }
          iVar2 = JetHead::CircularBuffer::byteAt(&this->mBuffer,0);
          if (iVar2 == 10) {
            JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x1,(size_t)pSVar6);
          }
          while (buffer._4_4_ = parseChunkLine(&this->mBuffer,(int *)&buffer), (int)buffer._4_4_ < 1
                ) {
            pSVar6 = &this->mSock;
            local_2e8 = (IReaderWriter *)0x0;
            if (pSVar6 != (Socket *)0x0) {
              local_2e8 = &(this->mSock).super_IReaderWriter;
            }
            iVar2 = JetHead::CircularBuffer::getFreeSpace(&this->mBuffer);
            local_178 = JetHead::CircularBuffer::fillFromFile(&this->mBuffer,local_2e8,iVar2);
            if (local_178 < 0) {
              jh_log_print(0,
                           "int HttpAgent::sendAndGet(HttpRequest &, HttpResponse &, const std::string &, BodyHandler *)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/HttpAgent.cpp"
                           ,0x11a,"Socket read failed...");
              this_local._4_4_ = 0xd;
              goto LAB_00124b9e;
            }
            iVar2 = JetHead::CircularBuffer::byteAt(&this->mBuffer,0);
            if (iVar2 == 0xd) {
              JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x1,(size_t)pSVar6);
            }
            iVar2 = JetHead::CircularBuffer::byteAt(&this->mBuffer,0);
            if (iVar2 == 10) {
              JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)0x1,(size_t)pSVar6);
            }
          }
          JetHead::CircularBuffer::read(&this->mBuffer,0,(void *)(ulong)buffer._4_4_,(size_t)pSVar6)
          ;
        }
        read_len = 0;
      }
    }
    if (handler != (BodyHandler *)0x0) {
      (**(code **)(*(long *)handler + 0x20))(handler,1);
    }
    if ((local_178 == 200) || (local_178 == 0xce)) {
      this_local._4_4_ = read_len;
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  else {
    HttpResponse::setResponseCode(res,-1);
    this_local._4_4_ = 2;
  }
LAB_00124b9e:
  length = 1;
  JetHead::Socket::Address::~Address((Address *)local_13c);
  URI::~URI((URI *)(addr.mName + 8));
  return this_local._4_4_;
}

Assistant:

int HttpAgent::sendAndGet( HttpRequest &req, HttpResponse &res, 
						   const std::string& toSend, BodyHandler* handler )
{
	URI uri = req.getURI();

	Socket::Address addr( uri.getHost().c_str(), uri.getPort() );
	bool first_line = true;
	int len;
	int ret;
	ErrCode err = kNoError;

	mSock.setReadTimeout( 5 );
	ret = mSock.connect( addr, 10 );

	if (ret != 0)
	{
		LOG_NOTICE("Socket connect failed...");
		res.setResponseCode(-1);
		return kConnectionFailed;
	}

	ret = req.send( &mSock );
	if (not toSend.empty())
	{
		if (mSock.write(toSend.c_str(), toSend.size()) != (int)toSend.size())
		{
			return kWriteFailed;
		}
	}

	mBuffer.clear();
	do
	{
		ret = mBuffer.fillFromFile(&mSock, mBuffer.getFreeSpace());

		if (ret <= 0)
		{
			LOG_NOTICE("Socket read failed...");
			return kReadFailed;
		}

		while (HttpHeaderBase::searchForLine(mBuffer) > 0)
		{
			if (first_line)
			{
				len = res.parseFirstLine(mBuffer);
				first_line = false;
			}
			else
			{
				len = res.parseLine(mBuffer);
			}

			if (len < 0)
			{
				LOG_NOTICE("Problem parsing response...");
			}
			else
			{
				mBuffer.read(NULL, len);
			}
		}
		
	} while (HttpHeaderBase::searchForLine(mBuffer) != HttpHeaderBase::kEOH or
			 mBuffer.getLength() < 2);

	ret = res.getResponseCode();

	// read \r\n from buffer
	mBuffer.read( NULL, 2 );			
	
	// Get Body of Response.

	int read_len, length = 0;	
	err = res.getFieldInt( HttpFieldMap::kFieldContentLength, length );
	if ( err == kNoError )
	{
		const char *buffer;
		int buffer_len;
		
		while ( length > 0 )
		{
			buffer = (const char *)mBuffer.getBytes( 0, buffer_len );
			
			if ( buffer_len > length )
				buffer_len = length;
			
			if ( handler != NULL )
				handler->handleData( buffer, buffer_len );
			
			mBuffer.read( NULL, buffer_len );
			length -= buffer_len;

			if (length)
			{
				ret = handler->handleSocket( mSock, length );	

				if (ret < 0)
					return kReadFailed;
				length = 0;
			}
		}
	}
	else
	{
		const char *encoding = res.getField( HttpFieldMap::kFieldTransferEncoding );

		if ( encoding != NULL && strcmp( encoding, "chunked" ) == 0 )
		{			
			while ((read_len = parseChunkLine( mBuffer, length )) <= 0)
			{
				ret = mBuffer.fillFromFile( &mSock, mBuffer.getFreeSpace() );

				if (ret < 0)
				{
					LOG_ERR("Socket read failed...");
					return kReadFailed;
				}	

				if ( mBuffer.byteAt( 0 ) == '\r' )
					mBuffer.read( NULL, 1 );
				if ( mBuffer.byteAt( 0 ) == '\n' )
					mBuffer.read( NULL, 1 );
				
			}

			mBuffer.read( NULL, read_len );
			
			while ( length > 0 )
			{
				const char *buffer;
				int buffer_len;
			
				while ( length > 0 )
				{
					buffer = (const char *)mBuffer.getBytes( 0, buffer_len );
					
					if ( buffer_len > length )
						buffer_len = length;

					if ( (handler != NULL ) && (buffer_len) )
					{
						handler->handleData( buffer, buffer_len );
					
						mBuffer.read( NULL, buffer_len );
						length -= buffer_len;
					}

					if (length)
					{
						ret = handler->handleSocket( mSock, length );	

						if (ret <= 0)
						{
							if (ret == 0)
								return kNoError;
							else
								return kReadFailed;
						}
						length = 0;
					}

				}

				ret = mBuffer.fillFromFile( &mSock, mBuffer.getFreeSpace() );

				if (ret < 0)
				{
					LOG_ERR("Socket read failed...");
					return kReadFailed;
				}

				if ( mBuffer.byteAt( 0 ) == '\r' )
					mBuffer.read( NULL, 1 );
				if ( mBuffer.byteAt( 0 ) == '\n' )
					mBuffer.read( NULL, 1 );

				while ((read_len = parseChunkLine( mBuffer, length )) <= 0)
				{
					ret = mBuffer.fillFromFile( &mSock, mBuffer.getFreeSpace() );
					if (ret < 0)
					{
						LOG_ERR("Socket read failed...");
						return kReadFailed;
					}

					if ( mBuffer.byteAt( 0 ) == '\r' )
						mBuffer.read( NULL, 1 );
					if ( mBuffer.byteAt( 0 ) == '\n' )
						mBuffer.read( NULL, 1 );
				}

				mBuffer.read( NULL, read_len );
			}
			
			err = kNoError;
		}
	}

	if ( handler != NULL )
		handler->setStop(true);

	if ( !(( ret == 200 ) || ( ret == 206)) )
	{
		LOG_NOTICE("File not found... response code = %d", ret);
		return kNotFound;
	}

	return err;
}